

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O2

void dict_free(dict_t *d)

{
  dictword_t *ptr;
  void *pvVar1;
  char **ptr_00;
  long lVar2;
  long lVar3;
  
  if (d != (dict_t *)0x0) {
    lVar3 = 8;
    for (lVar2 = 0; ptr = d->word, lVar2 < d->n_word; lVar2 = lVar2 + 1) {
      pvVar1 = *(void **)((long)ptr + lVar3 + -8);
      if (pvVar1 != (void *)0x0) {
        ckd_free(pvVar1);
      }
      pvVar1 = *(void **)((long)&ptr->word + lVar3);
      if (pvVar1 != (void *)0x0) {
        ckd_free(pvVar1);
      }
      lVar3 = lVar3 + 0x20;
    }
    if (ptr != (dictword_t *)0x0) {
      ckd_free(ptr);
    }
    for (lVar3 = 0; ptr_00 = d->ciphone_str, lVar3 < d->n_ciphone; lVar3 = lVar3 + 1) {
      if (ptr_00[lVar3] != (char *)0x0) {
        ckd_free(ptr_00[lVar3]);
      }
    }
    if (ptr_00 != (char **)0x0) {
      ckd_free(ptr_00);
    }
    if (d->pht != (hash_table_t *)0x0) {
      hash_table_free(d->pht);
    }
    if (d->ht != (hash_table_t *)0x0) {
      hash_table_free(d->ht);
    }
    ckd_free(d);
    return;
  }
  return;
}

Assistant:

void
dict_free(dict_t * d)
{
    int i;
    dictword_t *word;

    if (d) {                    /* Clean up the dictionary stuff */
        /* First Step, free all memory allocated for each word */
        for (i = 0; i < d->n_word; i++) {
            word = (dictword_t *) & (d->word[i]);
            if (word->word)
                ckd_free((void *) word->word);
            if (word->ciphone)
                ckd_free((void *) word->ciphone);
        }

        if (d->word)
            ckd_free((void *) d->word);
        for (i = 0; i < d->n_ciphone; i++) {
            if (d->ciphone_str[i])
                ckd_free((void *) d->ciphone_str[i]);
        }
        if (d->ciphone_str)
            ckd_free((void *) d->ciphone_str);
        if (d->pht)
            hash_table_free(d->pht);
        if (d->ht)
            hash_table_free(d->ht);
        ckd_free((void *) d);
    }
}